

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t42parse.c
# Opt level: O0

FT_Error t42_parser_init(T42_Parser parser,FT_Stream stream,FT_Memory memory,PSAux_Service psaux)

{
  FT_Alloc_Func count;
  int iVar1;
  uchar *puVar2;
  FT_Long size;
  PSAux_Service pPStack_28;
  FT_Error error;
  PSAux_Service psaux_local;
  FT_Memory memory_local;
  FT_Stream stream_local;
  T42_Parser parser_local;
  
  size._4_4_ = 0;
  pPStack_28 = psaux;
  psaux_local = (PSAux_Service)memory;
  memory_local = (FT_Memory)stream;
  stream_local = (FT_Stream)parser;
  (*psaux->ps_parser_funcs->init)(&parser->root,(FT_Byte *)0x0,(FT_Byte *)0x0,memory);
  stream_local[1].cursor = (uchar *)memory_local;
  stream_local[2].base = (uchar *)0x0;
  stream_local[1].limit = (uchar *)0x0;
  *(undefined1 *)&stream_local[2].size = 0;
  size._4_4_ = FT_Stream_Seek((FT_Stream)memory_local,0);
  if ((size._4_4_ == 0) &&
     (size._4_4_ = FT_Stream_EnterFrame((FT_Stream)memory_local,0x11), size._4_4_ == 0)) {
    iVar1 = memcmp(memory_local[2].user,"%!PS-TrueTypeFont",0x11);
    if (iVar1 != 0) {
      size._4_4_ = 2;
    }
    FT_Stream_ExitFrame((FT_Stream)memory_local);
    if ((size._4_4_ == 0) &&
       (size._4_4_ = FT_Stream_Seek((FT_Stream)memory_local,0), size._4_4_ == 0)) {
      count = memory_local->alloc;
      if (memory_local[1].alloc == (FT_Alloc_Func)0x0) {
        stream_local[1].limit = (uchar *)(memory_local->free + (long)memory_local->user);
        stream_local[2].base = (uchar *)count;
        *(undefined1 *)&stream_local[2].size = 1;
        size._4_4_ = FT_Stream_Skip((FT_Stream)memory_local,(FT_Long)count);
        if (size._4_4_ != 0) goto LAB_00352ccf;
      }
      else {
        puVar2 = (uchar *)ft_mem_alloc((FT_Memory)psaux_local,(FT_Long)count,
                                       (FT_Error *)((long)&size + 4));
        stream_local[1].limit = puVar2;
        if ((size._4_4_ != 0) ||
           (size._4_4_ = FT_Stream_Read((FT_Stream)memory_local,stream_local[1].limit,
                                        (FT_ULong)count), size._4_4_ != 0)) goto LAB_00352ccf;
        stream_local[2].base = (uchar *)count;
      }
      stream_local->size = (unsigned_long)stream_local[1].limit;
      stream_local->base = stream_local[1].limit;
      stream_local->pos = (unsigned_long)(stream_local->base + (long)stream_local[2].base);
    }
  }
LAB_00352ccf:
  if ((size._4_4_ != 0) && ((char)stream_local[2].size == '\0')) {
    ft_mem_free((FT_Memory)psaux_local,stream_local[1].limit);
    stream_local[1].limit = (uchar *)0x0;
  }
  return size._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  t42_parser_init( T42_Parser     parser,
                   FT_Stream      stream,
                   FT_Memory      memory,
                   PSAux_Service  psaux )
  {
    FT_Error  error = FT_Err_Ok;
    FT_Long   size;


    psaux->ps_parser_funcs->init( &parser->root, NULL, NULL, memory );

    parser->stream    = stream;
    parser->base_len  = 0;
    parser->base_dict = NULL;
    parser->in_memory = 0;

    /*******************************************************************/
    /*                                                                 */
    /* Here a short summary of what is going on:                       */
    /*                                                                 */
    /*   When creating a new Type 42 parser, we try to locate and load */
    /*   the base dictionary, loading the whole font into memory.      */
    /*                                                                 */
    /*   When `loading' the base dictionary, we only set up pointers   */
    /*   in the case of a memory-based stream.  Otherwise, we allocate */
    /*   and load the base dictionary in it.                           */
    /*                                                                 */
    /*   parser->in_memory is set if we have a memory stream.          */
    /*                                                                 */

    if ( FT_STREAM_SEEK( 0L ) ||
         FT_FRAME_ENTER( 17 ) )
      goto Exit;

    if ( ft_memcmp( stream->cursor, "%!PS-TrueTypeFont", 17 ) != 0 )
    {
      FT_TRACE2(( "  not a Type42 font\n" ));
      error = FT_THROW( Unknown_File_Format );
    }

    FT_FRAME_EXIT();

    if ( error || FT_STREAM_SEEK( 0 ) )
      goto Exit;

    size = (FT_Long)stream->size;

    /* now, try to load `size' bytes of the `base' dictionary we */
    /* found previously                                          */

    /* if it is a memory-based resource, set up pointers */
    if ( !stream->read )
    {
      parser->base_dict = (FT_Byte*)stream->base + stream->pos;
      parser->base_len  = size;
      parser->in_memory = 1;

      /* check that the `size' field is valid */
      if ( FT_STREAM_SKIP( size ) )
        goto Exit;
    }
    else
    {
      /* read segment in memory */
      if ( FT_ALLOC( parser->base_dict, size )       ||
           FT_STREAM_READ( parser->base_dict, size ) )
        goto Exit;

      parser->base_len = size;
    }

    parser->root.base   = parser->base_dict;
    parser->root.cursor = parser->base_dict;
    parser->root.limit  = parser->root.cursor + parser->base_len;

  Exit:
    if ( error && !parser->in_memory )
      FT_FREE( parser->base_dict );

    return error;
  }